

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

void lj_meta_init(lua_State *L)

{
  uint uVar1;
  GCstr *pGVar2;
  long in_RDI;
  bool bVar3;
  GCstr *s;
  uint32_t mm;
  char *q;
  char *p;
  global_State *g;
  char *metanames;
  uint local_2c;
  char *local_28;
  char *local_20;
  
  uVar1 = *(uint *)(in_RDI + 8);
  local_2c = 0;
  local_20 = 
  "__index__newindex__gc__mode__eq__len__lt__le__concat__call__add__sub__mul__div__mod__pow__unm__metatable__tostring__new__pairs__ipairs"
  ;
  while (*local_20 != '\0') {
    local_28 = local_20 + 2;
    while( true ) {
      bVar3 = false;
      if (*local_28 != '\0') {
        bVar3 = *local_28 != '_';
      }
      if (!bVar3) break;
      local_28 = local_28 + 1;
    }
    pGVar2 = lj_str_new((lua_State *)g,p,(size_t)q);
    *(int *)((ulong)uVar1 + 0x198 + (ulong)local_2c * 4) = (int)pGVar2;
    local_2c = local_2c + 1;
    local_20 = local_28;
  }
  return;
}

Assistant:

void lj_meta_init(lua_State *L)
{
#define MMNAME(name)	"__" #name
  const char *metanames = MMDEF(MMNAME);
#undef MMNAME
  global_State *g = G(L);
  const char *p, *q;
  uint32_t mm;
  for (mm = 0, p = metanames; *p; mm++, p = q) {
    GCstr *s;
    for (q = p+2; *q && *q != '_'; q++) ;
    s = lj_str_new(L, p, (size_t)(q-p));
    /* NOBARRIER: g->gcroot[] is a GC root. */
    setgcref(g->gcroot[GCROOT_MMNAME+mm], obj2gco(s));
  }
}